

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

void __thiscall cmCommandArgumentParserHelper::Error(cmCommandArgumentParserHelper *this,char *str)

{
  size_t sVar1;
  ostream *poVar2;
  ostringstream ostr;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  if (str == (char *)0x0) {
    std::ios::clear((int)(_func_int *)
                         ((long)local_1b8 + (long)*(_func_int **)(local_198._0_8_ + -0x18)) + 0x20);
  }
  else {
    sVar1 = strlen(str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,str,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," (",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__cxx11::stringbuf::str();
  if ((this->ErrorString)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->ErrorString);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return;
}

Assistant:

void cmCommandArgumentParserHelper::Error(const char* str)
{
  auto pos = this->InputBufferPos;
  auto const isEof = (this->InputSize < this->InputBufferPos);
  if (!isEof) {
    pos -= this->LastTokenLength;
  }

  std::ostringstream ostr;
  ostr << str << " (" << pos << ")";
  this->SetError(ostr.str());
}